

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O2

void ngx_rbtree_right_rotate
               (ngx_rbtree_node_t **root,ngx_rbtree_node_t *sentinel,ngx_rbtree_node_t *node)

{
  ngx_rbtree_node_t *pnVar1;
  ngx_rbtree_node_t *pnVar2;
  
  pnVar1 = node->left;
  pnVar2 = pnVar1->right;
  node->left = pnVar2;
  if (pnVar2 != sentinel) {
    pnVar2->parent = node;
  }
  pnVar2 = node->parent;
  pnVar1->parent = pnVar2;
  if (*root != node) {
    root = &pnVar2->left;
    if (pnVar2->right == node) {
      root = &pnVar2->right;
    }
  }
  *root = pnVar1;
  pnVar1->right = node;
  node->parent = pnVar1;
  return;
}

Assistant:

static ngx_inline void
ngx_rbtree_right_rotate(ngx_rbtree_node_t **root, ngx_rbtree_node_t *sentinel,
    ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  *temp;

    temp = node->left;
    node->left = temp->right;

    if (temp->right != sentinel) {
        temp->right->parent = node;
    }

    temp->parent = node->parent;

    if (node == *root) {
        *root = temp;

    } else if (node == node->parent->right) {
        node->parent->right = temp;

    } else {
        node->parent->left = temp;
    }

    temp->right = node;
    node->parent = temp;
}